

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::process_context::process_context(process_context *this,size_t ss)

{
  function<bool_(void_*)> *this_00;
  atomic<bool> *this_01;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  stack_type<cs_impl::any,_std::allocator> *this_02;
  undefined1 in_stack_ffffffffffffff2f;
  _func_bool_void_ptr **in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff48;
  listener_type *default_listener;
  _func_bool_void_ptr *local_78 [4];
  code *local_58;
  listener_type local_50;
  allocator local_29;
  int local_28 [5];
  allocator local_11;
  undefined8 local_10;
  
  *in_RDI = 0;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(in_RDI + 8),"3.4.3 Castor fiber(Stable) Build 14",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  local_28[0] = 0x3364c;
  numeric::numeric<int>((numeric *)(in_RDI + 0x30),local_28);
  *(undefined4 *)(in_RDI + 0x50) = 8;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x58),".",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *(undefined8 *)(in_RDI + 0x78) = local_10;
  this_02 = (stack_type<cs_impl::any,_std::allocator> *)(in_RDI + 0x80);
  stack_type<cs_impl::any,_std::allocator>::stack_type(this_02,in_stack_ffffffffffffff48);
  this_00 = (function<bool_(void_*)> *)(in_RDI + 0xa8);
  local_58 = on_process_exit_default_handler;
  default_listener = &local_50;
  std::function<bool(void*)>::function<bool(*)(void*),void>(this_00,in_stack_ffffffffffffff38);
  event_type::event_type((event_type *)this_02,default_listener);
  std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x5349ed);
  this_01 = (atomic<bool> *)(in_RDI + 0xd0);
  std::function<bool(void*)>::function<bool(*)(void*),void>(this_00,local_78);
  event_type::event_type((event_type *)this_02,default_listener);
  std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x534a38);
  *(code **)(in_RDI + 0xf8) = std_defalt_exception_handler;
  *(code **)(in_RDI + 0x100) = cs_defalt_exception_handler;
  std::atomic<bool>::operator=(this_01,(bool)in_stack_ffffffffffffff2f);
  return;
}

Assistant:

explicit process_context(std::size_t ss) : stack_size(ss), stack(ss), on_process_exit(&on_process_exit_default_handler), on_process_sigint(&on_process_exit_default_handler)
		{
			is_sigint_raised = false;
		}